

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

KTXTexture2 __thiscall ktx::CommandCreate::createTexture(CommandCreate *this,ImageSpec *target)

{
  pointer psVar1;
  _func_int *p_Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  long in_RDX;
  uint uVar7;
  string orientation;
  char *local_78;
  char *local_70;
  char local_68;
  undefined7 uStack_67;
  long local_58 [3];
  undefined8 uStack_40;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  byte bStack_2c;
  undefined1 uStack_2b;
  undefined2 uStack_2a;
  
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0;
  bStack_2c = 0;
  uStack_2b = 0;
  uStack_2a = 0;
  local_58[2] = 0;
  uStack_40 = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  uVar4 = *(uint *)(in_RDX + 0x78);
  if (uVar4 != *(uint *)&target[7].formatDesc.samples.
                         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("target.depth() == baseDepth",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                  ,0x98e,"KTXTexture2 ktx::CommandCreate::createTexture(const ImageSpec &)");
  }
  local_58[0] = (ulong)*(uint *)((long)&(target->formatDesc).extended.iccProfile.profile.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 0xc) << 0x20;
  psVar1 = target[7].formatDesc.samples.
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uStack_34 = SUB84(psVar1,0);
  uStack_30 = (undefined4)((ulong)psVar1 >> 0x20);
  bStack_2c = *(int *)((long)&target[1].formatDesc.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4) != 0 &
              *(byte *)&target[1].formatDesc.samples.
                        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = *(uint *)(in_RDX + 0x70);
  local_58[2] = *(long *)(in_RDX + 0x70);
  uVar7 = 1;
  if (*(char *)((long)&(target->formatDesc).extended.iccProfile.profile.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8) == '\0') {
    uVar7 = *(int *)((long)&target[1].formatDesc.extended.iccProfile.profile.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x14) != 0 &
            *(byte *)&target[1].formatDesc.samples.
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start | 2;
  }
  uStack_40 = CONCAT44(uVar7,uVar4);
  if (*(char *)((long)&target[1].formatDesc.samples.
                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) == '\x01') {
    uStack_2b = 1;
    local_38 = 1;
  }
  else {
    uStack_2b = 0;
    if (*(char *)((long)&target[1].formatDesc.samples.
                         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) == '\x01') {
      if (uVar4 < *(uint *)(in_RDX + 0x74)) {
        uVar4 = *(uint *)(in_RDX + 0x74);
      }
      if (uVar4 < uVar5) {
        uVar4 = uVar5;
      }
      uVar4 = uVar4 >> 1 | uVar4;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar4 = uVar4 >> 0x10 | uVar4;
      uVar4 = ~(uVar4 >> 1) & uVar4;
      uVar5 = 0;
      if (*(char *)&target[1].formatDesc.samples.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
        uVar5 = (uint)(0xffff < uVar4) * 0x10 + (uint)((uVar4 & 0xff00ff00) != 0) * 8 +
                (uint)((uVar4 & 0xf0f0f0f0) != 0) * 4 + (uint)((uVar4 & 0xcccccccc) != 0) * 2;
        local_38 = ((uVar4 & 0xaaaaaaaa) != 0) + uVar5 + 1;
        goto LAB_00159fdb;
      }
    }
    else {
      local_38 = 1;
      if (*(char *)&target[1].formatDesc.samples.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') goto LAB_00159fdb;
    }
    local_38 = *(int *)((long)&target[1].formatDesc.samples.
                               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
LAB_00159fdb:
  (this->super_Command)._vptr_Command = (_func_int **)0x0;
  iVar3 = ktxTexture2_Create(local_58,1,this,uVar5);
  if (iVar3 != 0) {
    local_78 = (char *)ktxErrorString(iVar3);
    Reporter::fatal<char_const(&)[46],char_const*>
              ((Reporter *)&(target->formatDesc).basic.field_0x8,DFD_FAILURE,
               (char (*) [46])"Failed to create ktxTexture: libktx error: {}",&local_78);
  }
  p_Var2 = (this->super_Command)._vptr_Command[0x10];
  uVar4 = *(uint *)(p_Var2 + 0xc);
  uVar5 = (uint)*(byte *)(in_RDX + 1) << 8;
  *(uint *)(p_Var2 + 0xc) = uVar5 | uVar4 & 0xffff00ff;
  *(uint *)(p_Var2 + 0xc) = (uint)*(byte *)(in_RDX + 2) << 0x10 | uVar5 | uVar4 & 0xff0000ff;
  if ((*(char *)((long)&target[3].formatDesc.extended.iccProfile.profile.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0xb) != '\0') ||
     (*(char *)((long)&target[3].formatDesc.extended.iccProfile.profile.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0xf) == '\x01')) {
    local_70 = (char *)0x0;
    local_68 = '\0';
    local_78 = &local_68;
    std::__cxx11::string::resize((ulong)&local_78,'\x03');
    pcVar6 = "l";
    if (*(char *)(in_RDX + 0x7c) == '\0') {
      pcVar6 = "r";
    }
    std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,(ulong)pcVar6);
    if ((*(char *)((long)&(target->formatDesc).extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8) == '\0') &&
       (std::__cxx11::string::append((char *)&local_78),
       *(char *)&target[1].formatDesc.samples.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_start == '\x01')) {
      std::__cxx11::string::append((char *)&local_78);
    }
    ktxHashList_AddKVPair
              ((this->super_Command)._vptr_Command + 10,"KTXorientation",(int)local_70 + 1,local_78)
    ;
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return (KTXTexture2)(ktxTexture2 *)this;
}

Assistant:

KTXTexture2 CommandCreate::createTexture(const ImageSpec& target) {
    ktxTextureCreateInfo createInfo;
    std::memset(&createInfo, 0, sizeof(createInfo));

    assert(target.depth() == baseDepth);

    createInfo.vkFormat = options.vkFormat;
    createInfo.numFaces = numFaces;
    createInfo.numLayers = numLayers;
    createInfo.isArray = options.layers > 0u;
    createInfo.baseWidth = target.width();
    createInfo.baseHeight = target.height();
    createInfo.baseDepth = target.depth();
    createInfo.numDimensions = options._1d ? 1 : (options.depth > 0u ? 3 : 2);

    if (options.mipmapRuntime) {
        createInfo.generateMipmaps = true;
        createInfo.numLevels = 1;
    } else {
        createInfo.generateMipmaps = false;
        if (options.mipmapGenerate) {
            const auto maxDimension = std::max(target.width(), std::max(target.height(), target.depth()));
            const auto maxLevels = log2(maxDimension) + 1;
            createInfo.numLevels = options.levels.value_or(maxLevels);
        } else {
            createInfo.numLevels = options.levels.value_or(1);
        }
    }

    KTXTexture2 texture{nullptr};
    ktx_error_code_e ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, texture.pHandle());
    if (KTX_SUCCESS != ret)
        fatal(rc::KTX_FAILURE, "Failed to create ktxTexture: libktx error: {}", ktxErrorString(ret));

    KHR_DFDSETVAL(texture->pDfd + 1, PRIMARIES, target.format().primaries());
    KHR_DFDSETVAL(texture->pDfd + 1, TRANSFER, target.format().transfer());

    // Add KTXorientation metadata
    if (options.assignTexcoordOrigin.has_value() || options.convertTexcoordOrigin.has_value()) {
        // This code is future-proofed by supporting "right" origin and 1d
        // textures. Current imitations are enforced by CL option parsing.
        std::string orientation;
        orientation.resize(3);
        orientation = target.origin().x == ImageSpec::Origin::eLeft ? "r" : "l";
        if (!options._1d) {
            orientation += target.origin().y == ImageSpec::Origin::eTop ? "d" : "u";
            if (options.depth.has_value()) {
                orientation += target.origin().z == ImageSpec::Origin::eFront ? "i" : "o";
            }
        }

        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                static_cast<uint32_t>(orientation.size() + 1), // +1 to include the \0
                orientation.c_str());
    }

    return texture;
}